

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O1

bool __thiscall rtc::CriticalSection::TryEnter(CriticalSection *this)

{
  PlatformThreadRef *a;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  PlatformThreadRef PVar4;
  FatalMessage local_198;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    a = &this->thread_;
    if (this->recursion_count_ == 0) {
      if (*a != 0) {
        FatalMessage::FatalMessage
                  (&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
                   ,0x82);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_198,"Check failed: !thread_",0x16);
        std::ios::widen((char)&local_198 + (char)*(undefined8 *)(local_198._0_8_ - 0x18));
        std::ostream::put((char)&local_198);
        poVar3 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
LAB_0013ad73:
        FatalMessage::~FatalMessage(&local_198);
      }
      PVar4 = CurrentThreadRef();
      *a = PVar4;
    }
    else {
      local_198._0_8_ = CurrentThreadRef();
      bVar1 = IsThreadRefEqual(a,(PlatformThreadRef *)&local_198);
      if (!bVar1) {
        FatalMessage::FatalMessage
                  (&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
                   ,0x85);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_198,"Check failed: CurrentThreadIsOwner()",0x24);
        std::ios::widen((char)&local_198 + (char)*(undefined8 *)(local_198._0_8_ - 0x18));
        std::ostream::put((char)&local_198);
        poVar3 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
        if (!bVar1) goto LAB_0013ad73;
      }
    }
    this->recursion_count_ = this->recursion_count_ + 1;
  }
  return iVar2 == 0;
}

Assistant:

EXCLUSIVE_TRYLOCK_FUNCTION(true) {
#if defined(WEBRTC_WIN)
  return TryEnterCriticalSection(&crit_) != FALSE;
#else
#if defined(WEBRTC_MAC) && !USE_NATIVE_MUTEX_ON_MAC
  if (!IsThreadRefEqual(owning_thread_, CurrentThreadRef())) {
    if (AtomicOps::CompareAndSwap(&lock_queue_, 0, 1) != 0)
      return false;
    owning_thread_ = CurrentThreadRef();
    RTC_DCHECK(!recursion_);
  } else {
    AtomicOps::Increment(&lock_queue_);
  }
  ++recursion_;
#else
  if (pthread_mutex_trylock(&mutex_) != 0)
    return false;
#endif
#if CS_DEBUG_CHECKS
  if (!recursion_count_) {
    RTC_DCHECK(!thread_);
    thread_ = CurrentThreadRef();
  } else {
    RTC_DCHECK(CurrentThreadIsOwner());
  }
  ++recursion_count_;
#endif
  return true;
#endif
}